

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O1

string * __thiscall GraphNode::dotGraph_abi_cxx11_(string *__return_storage_ptr__,GraphNode *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  iterator iVar9;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong *puVar13;
  ulong uVar14;
  GraphNode *pGVar15;
  uint uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar17;
  string __str;
  string __str_2;
  string __str_1;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string *local_90;
  GraphNode *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_> *local_40;
  element_type *local_38;
  
  uVar2 = this->m_value;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar16 = 1;
  if (9 < uVar3) {
    uVar14 = (ulong)uVar3;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar7 = (uint)uVar14;
      if (uVar7 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_001300ea;
      }
      if (uVar7 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_001300ea;
      }
      if (uVar7 < 10000) goto LAB_001300ea;
      uVar14 = uVar14 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar7);
    uVar16 = uVar16 + 1;
  }
LAB_001300ea:
  local_118 = &local_108;
  local_88 = this;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_118 + (ulong)(uVar2 >> 0x1f)),uVar16,uVar3);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x14b3fb);
  pGVar15 = local_88;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_e8 = *plVar11;
    lStack_e0 = plVar8[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar11;
    local_f8 = (long *)*plVar8;
  }
  local_f0 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar12) {
    lVar4 = plVar8[3];
    local_98->_M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  iVar9._M_current =
       (pGVar15->m_pointers).
       super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (iVar9._M_current !=
      (pGVar15->m_pointers).
      super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_40 = &pGVar15->m_pointers;
    local_90 = __return_storage_ptr__;
    do {
      this_00 = ((iVar9._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if ((this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (this_00->_M_use_count == 0)) {
        iVar9 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
                _M_erase(local_40,iVar9);
        iVar9._M_current = iVar9._M_current + -1;
      }
      else {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar6 = this_00->_M_use_count;
          do {
            if (iVar6 == 0) {
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = this_00->_M_use_count;
            bVar17 = iVar6 == iVar1;
            if (bVar17) {
              this_00->_M_use_count = iVar6 + 1;
              iVar1 = iVar6;
            }
            iVar6 = iVar1;
            UNLOCK();
          } while (!bVar17);
        }
        local_38 = ((iVar9._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
        uVar2 = pGVar15->m_value;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar16 = 1;
        if (9 < uVar3) {
          uVar14 = (ulong)uVar3;
          uVar5 = 4;
          do {
            uVar16 = uVar5;
            uVar7 = (uint)uVar14;
            if (uVar7 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_001302ea;
            }
            if (uVar7 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_001302ea;
            }
            if (uVar7 < 10000) goto LAB_001302ea;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar16 + 4;
          } while (99999 < uVar7);
          uVar16 = uVar16 + 1;
        }
LAB_001302ea:
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct
                  ((ulong)local_60,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_60[0]),uVar16,uVar3);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x14b3fb);
        local_80 = &local_70;
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_70 = *plVar11;
          lStack_68 = plVar8[3];
        }
        else {
          local_70 = *plVar11;
          local_80 = (long *)*plVar8;
        }
        local_78 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_a8 = *puVar13;
          lStack_a0 = plVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar13;
          local_b8 = (ulong *)*plVar8;
        }
        local_b0 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        uVar2 = local_38->m_value;
        uVar3 = -uVar2;
        if (0 < (int)uVar2) {
          uVar3 = uVar2;
        }
        uVar16 = 1;
        if (9 < uVar3) {
          uVar14 = (ulong)uVar3;
          uVar5 = 4;
          do {
            uVar16 = uVar5;
            uVar7 = (uint)uVar14;
            if (uVar7 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_00130457;
            }
            if (uVar7 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_00130457;
            }
            if (uVar7 < 10000) goto LAB_00130457;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar16 + 4;
          } while (99999 < uVar7);
          uVar16 = uVar16 + 1;
        }
LAB_00130457:
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_d8,(char)uVar16 - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d8),uVar16,uVar3);
        pGVar15 = local_88;
        __return_storage_ptr__ = local_90;
        uVar14 = 0xf;
        if (local_b8 != &local_a8) {
          uVar14 = local_a8;
        }
        if (uVar14 < (ulong)(local_d0 + local_b0)) {
          uVar14 = 0xf;
          if (local_d8 != local_c8) {
            uVar14 = local_c8[0];
          }
          if (uVar14 < (ulong)(local_d0 + local_b0)) goto LAB_001304eb;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_001304eb:
          puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8)
          ;
        }
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_108 = *plVar8;
          uStack_100 = puVar10[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar8;
          local_118 = (long *)*puVar10;
        }
        local_110 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar11 = plVar8 + 2;
        if ((long *)*plVar8 == plVar11) {
          local_e8 = *plVar11;
          lStack_e0 = plVar8[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar11;
          local_f8 = (long *)*plVar8;
        }
        local_f0 = plVar8[1];
        *plVar8 = (long)plVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      iVar9._M_current = iVar9._M_current + 1;
    } while (iVar9._M_current !=
             (pGVar15->m_pointers).
             super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GraphNode::dotGraph() {
    std::string result = "\t" + std::to_string(m_value) + "\n";
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
        } else {
            auto pointer = iter->lock();
            result += "\t" + std::to_string(m_value) + "->" + std::to_string(pointer->m_value) + "\n";
        }

    return result;
}